

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::ConfigFileNames
          (cmQtAutoGenInitializer *this,ConfigString *configString,string_view prefix,
          string_view suffix)

{
  pointer pbVar1;
  mapped_type *this_00;
  pointer args;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  cmAlphaNum local_b0;
  string local_80;
  cmAlphaNum local_60;
  
  local_c0._M_str = suffix._M_str;
  local_c0._M_len = suffix._M_len;
  local_b0.View_._M_len = local_c0._M_len;
  local_b0.View_._M_str = local_c0._M_str;
  local_60.View_._M_len = prefix._M_len;
  local_60.View_._M_str = prefix._M_str;
  cmStrCat<>(&local_80,&local_60,&local_b0);
  std::__cxx11::string::operator=((string *)configString,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (this->MultiConfig == true) {
    pbVar1 = (this->ConfigsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (args = (this->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; args != pbVar1; args = args + 1) {
      local_b0.View_._M_len = 1;
      local_b0.View_._M_str = local_b0.Digits_;
      local_b0.Digits_[0] = '_';
      local_60.View_._M_len = prefix._M_len;
      local_60.View_._M_str = prefix._M_str;
      cmStrCat<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                (&local_80,&local_60,&local_b0,args,&local_c0);
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&configString->Config,args);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::ConfigFileNames(ConfigString& configString,
                                             cm::string_view prefix,
                                             cm::string_view suffix)
{
  configString.Default = cmStrCat(prefix, suffix);
  if (this->MultiConfig) {
    for (auto const& cfg : this->ConfigsList) {
      configString.Config[cfg] = cmStrCat(prefix, '_', cfg, suffix);
    }
  }
}